

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexical.h
# Opt level: O2

Node * __thiscall Lexical::mainProgram(Node *__return_storage_ptr__,Lexical *this)

{
  int *to_;
  pointer *ppiVar1;
  bool bVar2;
  long lVar3;
  allocator local_d9;
  int local_d8;
  int beginIndex;
  string local_d0;
  Node local_b0;
  Node subSon;
  
  Generator::pushIndex(&this->generator);
  beginIndex = this->wordIndex;
  local_b0.name._M_dataplus._M_p._0_4_ = 0xffffffff;
  std::__cxx11::string::string((string *)&subSon,"main",(allocator *)&local_d0);
  addProcedure(this,(int *)&local_b0,&subSon.name);
  std::__cxx11::string::~string((string *)&subSon);
  local_d0._M_dataplus._M_p._0_4_ = 0;
  std::__cxx11::string::string((string *)&local_b0,"main",(allocator *)&local_d8);
  subProgram(&subSon,this,(int *)&local_d0,&local_b0.name);
  std::__cxx11::string::~string((string *)&local_b0);
  bVar2 = Node::operator==(&subSon,&nullNode);
  if (!bVar2) {
    lVar3 = (long)this->wordIndex + 1;
    this->wordIndex = (int)lVar3;
    bVar2 = std::operator!=(&(this->words).super__Vector_base<Word,_std::allocator<Word>_>._M_impl.
                             super__Vector_impl_data._M_start[lVar3].token,".");
    if (!bVar2) {
      std::__cxx11::string::string((string *)&local_b0,"main",(allocator *)&local_d8);
      to_ = &this->wordIndex;
      local_d0._M_dataplus._M_p._0_4_ = this->nodeCnt;
      this->nodeCnt = (int)local_d0._M_dataplus._M_p + 1;
      Node::Node(__return_storage_ptr__,&local_b0.name,(int *)&local_d0,&beginIndex,to_);
      std::__cxx11::string::~string((string *)&local_b0);
      std::vector<Node,std::allocator<Node>>::emplace_back<Node_const&>
                ((vector<Node,std::allocator<Node>> *)&__return_storage_ptr__->son,&subSon);
      std::__cxx11::string::string((string *)&local_d0,".",&local_d9);
      local_d8 = this->nodeCnt;
      this->nodeCnt = local_d8 + 1;
      Node::Node(&local_b0,&local_d0,&local_d8,to_,to_);
      std::vector<Node,std::allocator<Node>>::emplace_back<Node_const&>
                ((vector<Node,std::allocator<Node>> *)&__return_storage_ptr__->son,&local_b0);
      Node::~Node(&local_b0);
      std::__cxx11::string::~string((string *)&local_d0);
      this->lastErrorIndex = -1;
      this->lastErrorCode = -1;
      ppiVar1 = &(this->generator).sizeStack.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppiVar1 = *ppiVar1 + -1;
      goto LAB_00104967;
    }
  }
  errorParsing(__return_storage_ptr__,this,&beginIndex,-1,-1);
LAB_00104967:
  Node::~Node(&subSon);
  return __return_storage_ptr__;
}

Assistant:

Node mainProgram() {
		generator.pushIndex();
		int beginIndex = wordIndex;
		addProcedure(-1, "main");

		Node subSon = subProgram(0, "main");
		if (subSon == nullNode) return errorParsing(beginIndex);

		if (words[++wordIndex].token != ".") return errorParsing(beginIndex); // BASE ERROR

		Node now = Node("main", nodeCnt++, beginIndex, wordIndex);
		now.insertSon(subSon);
		now.insertSon(Node(".", nodeCnt++, wordIndex, wordIndex));

		lastErrorIndex = -1;
		lastErrorCode = -1;
		generator.popIndex();
		return now;
	}